

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  const_reference plVar4;
  ulong uVar5;
  const_reference puVar6;
  ulong *puVar7;
  const_reference puVar8;
  const_reference piVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  undefined4 in_register_00000034;
  LogMessage LStack_30;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 2) == 0) {
      iVar2 = 0x1f;
      if ((number | 1U) != 0) {
        for (; (number | 1U) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      if ((this->field_0xa & 4) == 0) {
        lVar10 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar10 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar11 = (uint)lVar10 | 1;
      iVar3 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar13 = (ulong)(iVar2 * 9 + 0x49U >> 6) + 4 + lVar10 + (ulong)(iVar3 * 9 + 0x49U >> 6);
    }
    else {
      sVar13 = 0;
    }
    return sVar13;
  }
  if (this->is_repeated == true) {
    bVar1 = this->type;
    if (this->is_packed == true) {
      switch((uint)bVar1) {
      case 1:
      case 6:
      case 0x10:
        uVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        uVar12 = (ulong)uVar11 << 3;
        break;
      case 2:
      case 7:
      case 0xf:
        uVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        uVar12 = (ulong)uVar11 << 2;
        break;
      case 3:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) {
LAB_001f55d6:
          *(undefined4 *)(this->cached_size).int_ = 0;
          return 0;
        }
        uVar12 = 0;
        iVar2 = 0;
        do {
          puVar7 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar2);
          lVar10 = 0x3f;
          if ((*puVar7 | 1) != 0) {
            for (; (*puVar7 | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          uVar12 = uVar12 + ((int)lVar10 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      case 4:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) goto LAB_001f55d6;
        uVar12 = 0;
        iVar2 = 0;
        do {
          puVar8 = RepeatedField<unsigned_long>::Get
                             ((RepeatedField<unsigned_long> *)this->field_0,iVar2);
          lVar10 = 0x3f;
          if ((*puVar8 | 1) != 0) {
            for (; (*puVar8 | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          uVar12 = uVar12 + ((int)lVar10 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      case 5:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) goto LAB_001f55d6;
        uVar12 = 0;
        iVar2 = 0;
        do {
          piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
          lVar10 = 0x3f;
          if (((long)*piVar9 | 1U) != 0) {
            for (; ((long)*piVar9 | 1U) >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          uVar12 = uVar12 + ((int)lVar10 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      case 8:
        uVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        uVar12 = (ulong)uVar11;
        break;
      case 9:
      case 10:
      case 0xb:
      case 0xc:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x5e4);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&LStack_30,(char (*) [37])"Non-primitive types can\'t be packed.");
        goto LAB_001f5afa;
      case 0xd:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) goto LAB_001f55d6;
        uVar12 = 0;
        iVar2 = 0;
        do {
          puVar6 = RepeatedField<unsigned_int>::Get
                             ((RepeatedField<unsigned_int> *)this->field_0,iVar2);
          iVar3 = 0x1f;
          if ((*puVar6 | 1) != 0) {
            for (; (*puVar6 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar12 = uVar12 + (iVar3 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      case 0xe:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) goto LAB_001f55d6;
        uVar12 = 0;
        iVar2 = 0;
        do {
          piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
          lVar10 = 0x3f;
          if (((long)*piVar9 | 1U) != 0) {
            for (; ((long)*piVar9 | 1U) >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          uVar12 = uVar12 + ((int)lVar10 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      case 0x11:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) goto LAB_001f55d6;
        uVar12 = 0;
        iVar2 = 0;
        do {
          piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
          uVar11 = *piVar9 >> 0x1f ^ *piVar9 * 2 | 1;
          iVar3 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar12 = uVar12 + (iVar3 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      case 0x12:
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar2 < 1) goto LAB_001f55d6;
        uVar12 = 0;
        iVar2 = 0;
        do {
          plVar4 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar2);
          uVar5 = *plVar4 >> 0x3f ^ *plVar4 * 2 | 1;
          lVar10 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          uVar12 = uVar12 + ((int)lVar10 * 9 + 0x49U >> 6);
          iVar2 = iVar2 + 1;
          iVar3 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                               (undefined1  [16])
                               ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar2 < iVar3);
        break;
      default:
        ByteSize();
        goto LAB_001f5ae6;
      }
      *(uint *)(this->cached_size).int_ = (uint)uVar12;
      if (uVar12 == 0) {
        return 0;
      }
      uVar11 = (uint)uVar12 | 1;
      iVar2 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar11 = number * 8 + 3;
      iVar3 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      return uVar12 + (iVar3 * 9 + 0x49U >> 6) + (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
    if (0xed < (byte)(bVar1 - 0x13)) {
      uVar11 = number * 8 + 1;
      iVar2 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar13 = (*(code *)(&DAT_002b5178 + *(int *)(&DAT_002b5178 + (ulong)(bVar1 - 1) * 4)))();
      return sVar13;
    }
  }
  else {
    if ((this->field_0xa & 2) != 0) {
      return 0;
    }
    if (0xed < (byte)(this->type - 0x13)) {
      uVar11 = number * 8 + 1;
      iVar2 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar13 = (*(code *)(&DAT_002b5130 + *(int *)(&DAT_002b5130 + (ulong)(this->type - 1) * 4)))
                         (this,CONCAT44(in_register_00000034,number),
                          &DAT_002b5130 + *(int *)(&DAT_002b5130 + (ulong)(this->type - 1) * 4));
      return sVar13;
    }
LAB_001f5ae6:
    ByteSize();
  }
  ByteSize();
LAB_001f5afa:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_30)
  ;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  our_size += WireFormatLite::LengthDelimitedSize(
      is_lazy ? ptr.lazymessage_value->ByteSizeLong()
              : ptr.message_value->ByteSizeLong());

  return our_size;
}